

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O0

atomBins * initBins(char serialNum,region *boundingBox,float delta)

{
  int iVar1;
  int iVar2;
  int iVar3;
  atomPtr ***__ptr;
  double dVar4;
  atomPtr *local_70;
  atomPtr *b3;
  atomPtr **b2;
  atomPtr ***b1;
  int n3;
  int n2;
  int n1;
  int nz;
  int ny;
  int nx;
  int k;
  int j;
  int i;
  atomBins *bp;
  float delta_local;
  region *boundingBox_local;
  atomBins *paStack_10;
  char serialNum_local;
  
  bp._4_4_ = delta;
  if (delta < 0.1) {
    bp._4_4_ = 5.0;
  }
  dVar4 = floor(((boundingBox->max).x - (boundingBox->min).x) / (double)bp._4_4_ + 1.0);
  iVar1 = (int)(dVar4 + 2.0);
  dVar4 = floor(((boundingBox->max).y - (boundingBox->min).y) / (double)bp._4_4_ + 1.0);
  iVar2 = (int)(dVar4 + 2.0);
  dVar4 = floor(((boundingBox->max).z - (boundingBox->min).z) / (double)bp._4_4_ + 1.0);
  iVar3 = (int)(dVar4 + 2.0);
  paStack_10 = (atomBins *)malloc(0x68);
  paStack_10->delta = bp._4_4_;
  (paStack_10->min).x = (boundingBox->min).x;
  (paStack_10->min).y = (boundingBox->min).y;
  (paStack_10->min).z = (boundingBox->min).z;
  (paStack_10->max).x = (boundingBox->max).x;
  (paStack_10->max).y = (boundingBox->max).y;
  (paStack_10->max).z = (boundingBox->max).z;
  v3sub((vector3d *)&paStack_10->max,(vector3d *)paStack_10,(vector3d *)&paStack_10->sz);
  paStack_10->nx = iVar1;
  paStack_10->ny = iVar2;
  paStack_10->nz = iVar3;
  paStack_10->binSerialNum = serialNum;
  __ptr = (atomPtr ***)malloc((long)iVar1 << 3);
  b3 = (atomPtr *)malloc((long)(iVar1 * iVar2) << 3);
  local_70 = (atomPtr *)malloc((long)(iVar1 * iVar2 * iVar3) << 3);
  if ((((paStack_10 == (atomBins *)0x0) || (__ptr == (atomPtr ***)0x0)) || (b3 == (atomPtr *)0x0))
     || (local_70 == (atomPtr *)0x0)) {
    warn("could not create atom bins");
    if (paStack_10 != (atomBins *)0x0) {
      free(paStack_10);
    }
    if (__ptr != (atomPtr ***)0x0) {
      free(__ptr);
    }
    if (b3 != (atomPtr *)0x0) {
      free(b3);
    }
    if (local_70 != (atomPtr *)0x0) {
      free(local_70);
    }
    paStack_10 = (atomBins *)0x0;
  }
  else {
    paStack_10->list = __ptr;
    for (k = 0; k < iVar1; k = k + 1) {
      paStack_10->list[k] = (atomPtr **)b3;
      b3 = b3 + iVar2;
      for (nx = 0; nx < iVar2; nx = nx + 1) {
        paStack_10->list[k][nx] = local_70;
        local_70 = local_70 + iVar3;
        for (ny = 0; ny < iVar3; ny = ny + 1) {
          paStack_10->list[k][nx][ny] = (atomPtr)0x0;
        }
      }
    }
  }
  return paStack_10;
}

Assistant:

atomBins* initBins(char serialNum, region *boundingBox, float delta) {
	atomBins *bp;
	int i, j, k, nx, ny, nz;
	int n1, n2, n3;
	atomPtr ***b1, **b2, *b3;

	if (delta < 0.1) delta = 5.0;

	nx = OFFSET(boundingBox->max.x, boundingBox->min.x, delta) + 2;
	ny = OFFSET(boundingBox->max.y, boundingBox->min.y, delta) + 2;
	nz = OFFSET(boundingBox->max.z, boundingBox->min.z, delta) + 2;

	bp = (atomBins *)malloc(sizeof(atomBins));

	bp->delta = delta;

	bp->min = boundingBox->min;
	bp->max = boundingBox->max;
	v3sub(&(bp->max), &(bp->min), &(bp->sz));
	bp->nx = nx;
	bp->ny = ny;
	bp->nz = nz;
	bp->binSerialNum = serialNum;

	n1 = nx;
	n2 = nx*ny;
	n3 = nx*ny*nz;

	b1 = (atomPtr ***)malloc(sizeof(atomPtr **)*n1);
	b2 = (atomPtr  **)malloc(sizeof(atomPtr  *)*n2);
	b3 = (atomPtr   *)malloc(sizeof(atomPtr   )*n3);
	if (!bp || !b1 || !b2 || !b3) {
		warn("could not create atom bins");
		if (bp) free(bp);
		if (b1) free(b1);
		if (b2) free(b2);
		if (b3) free(b3);
		return NULL;
	}

	bp->list = b1;

	for(i = 0; i < nx; i++) {
		bp->list[i] = b2; b2 += ny;

		for(j = 0; j < ny; j++) {
			bp->list[i][j] = b3; b3 += nz;

			for(k = 0; k < nz; k++) {
				bp->list[i][j][k] = 0;
			}
		}
	}

	return bp;
}